

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall adios2::profiling::Timer::~Timer(Timer *this)

{
  std::__cxx11::string::~string((string *)&this->m_Details);
  std::__cxx11::string::~string((string *)&this->m_LocalTimeDate);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

~Timer() = default;